

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O2

void __thiscall xs::TestDriver::TestDriver(TestDriver *this,TestProcess *testProcess)

{
  allocator_type local_11;
  
  this->m_state = STATE_NOT_STARTED;
  (this->m_lastLaunchFailure)._M_dataplus._M_p = (pointer)&(this->m_lastLaunchFailure).field_2;
  (this->m_lastLaunchFailure)._M_string_length = 0;
  (this->m_lastLaunchFailure).field_2._M_local_buf[0] = '\0';
  this->m_lastExitCode = 0;
  this->m_process = testProcess;
  this->m_lastProcessDataTime = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->m_dataMsgTmpBuf,0x1000,&local_11);
  return;
}

Assistant:

TestDriver::TestDriver (xs::TestProcess* testProcess)
	: m_state				(STATE_NOT_STARTED)
	, m_lastExitCode		(0)
	, m_process				(testProcess)
	, m_lastProcessDataTime	(0)
	, m_dataMsgTmpBuf		(SEND_RECV_TMP_BUFFER_SIZE)
{
}